

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall WriterTest_WriteDouble_Test::TestBody(WriterTest_WriteDouble_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_fffffffffffffed0;
  AssertionResult *pAVar4;
  char *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  int iVar5;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  double *in_stack_fffffffffffffef8;
  Type type;
  AssertHelper *in_stack_ffffffffffffff00;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  Message *in_stack_ffffffffffffff48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff50;
  AssertionResult local_88 [2];
  undefined8 local_68;
  AssertionResult local_58 [3];
  undefined8 local_28;
  AssertionResult local_18;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_28 = 0x4010cccccccccccd;
  (anonymous_namespace)::AnyWriteChecker::operator()
            ((AnyWriteChecker *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
             (char *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff00);
    testing::AssertionResult::failure_message((AssertionResult *)0x12aaee);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff00,(Type)((ulong)in_stack_fffffffffffffef8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),iVar5,
               in_stack_fffffffffffffee0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff50.ptr_,in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffed0);
    testing::Message::~Message((Message *)0x12ab4b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12aba0);
  local_68 = 0xc010cccccccccccd;
  this_00 = local_58;
  (anonymous_namespace)::AnyWriteChecker::operator()
            ((AnyWriteChecker *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
             &this_00->success_,in_stack_fffffffffffffef8);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffef8 =
         (double *)testing::AssertionResult::failure_message((AssertionResult *)0x12ac41);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,(Type)((ulong)in_stack_fffffffffffffef8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),iVar5,
               in_stack_fffffffffffffee0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff50.ptr_,in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffed0);
    testing::Message::~Message((Message *)0x12ac9e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12acf3);
  std::numeric_limits<double>::min();
  pAVar4 = local_88;
  (anonymous_namespace)::AnyWriteChecker::operator()
            ((AnyWriteChecker *)CONCAT17(uVar2,in_stack_ffffffffffffff08),&this_00->success_,
             in_stack_fffffffffffffef8);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  iVar5 = (int)((ulong)pAVar4 >> 0x20);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffee0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x12ad90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,(Type)((ulong)in_stack_fffffffffffffef8 >> 0x20),
               (char *)CONCAT17(uVar3,in_stack_fffffffffffffef0),iVar5,in_stack_fffffffffffffee0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff50.ptr_,in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffed0);
    testing::Message::~Message((Message *)0x12aded);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12ae42);
  std::numeric_limits<double>::max();
  pAVar4 = (AssertionResult *)&stack0xffffffffffffff48;
  (anonymous_namespace)::AnyWriteChecker::operator()
            ((AnyWriteChecker *)CONCAT17(uVar2,in_stack_ffffffffffffff08),&this_00->success_,
             in_stack_fffffffffffffef8);
  type = (Type)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x12aed3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)CONCAT17(uVar3,in_stack_fffffffffffffef0),iVar5,
               in_stack_fffffffffffffee0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff50.ptr_,in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar4);
    testing::Message::~Message((Message *)0x12af1f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12af6e);
  return;
}

Assistant:

TEST(WriterTest, WriteDouble) {
  CHECK_WRITE(4.2);
  CHECK_WRITE(-4.2);
  CHECK_WRITE(std::numeric_limits<double>::min());
  CHECK_WRITE(std::numeric_limits<double>::max());
}